

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

int compress(int elen,double *e,double *h)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  iVar2 = elen + -1;
  dVar7 = e[(long)elen + -1];
  if (1 < elen) {
    lVar3 = (ulong)(elen - 2) + 1;
    dVar6 = dVar7;
    do {
      dVar7 = dVar6 + e[lVar3 + -1];
      dVar6 = e[lVar3 + -1] - (dVar7 - dVar6);
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        lVar5 = (long)iVar2;
        iVar2 = iVar2 + -1;
        h[lVar5] = dVar7;
        dVar7 = dVar6;
      }
      lVar5 = lVar3 + -1;
      bVar1 = 0 < lVar3;
      lVar3 = lVar5;
      dVar6 = dVar7;
    } while (lVar5 != 0 && bVar1);
  }
  iVar4 = 0;
  if (iVar2 + 1 < elen) {
    lVar3 = (long)iVar2;
    iVar4 = 0;
    dVar6 = dVar7;
    do {
      dVar7 = dVar6 + h[lVar3 + 1];
      dVar6 = dVar6 - (dVar7 - h[lVar3 + 1]);
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        lVar5 = (long)iVar4;
        iVar4 = iVar4 + 1;
        h[lVar5] = dVar6;
      }
      lVar3 = lVar3 + 1;
      dVar6 = dVar7;
    } while (elen + -1 != (int)lVar3);
  }
  h[iVar4] = dVar7;
  return iVar4 + 1;
}

Assistant:

int compress(int elen, REAL *e, REAL *h)
/* e and h may be the same. */
{
  REAL Q, q;
  INEXACT REAL Qnew;
  int eindex, hindex;
  INEXACT REAL bvirt;
  REAL enow, hnow;
  int top, bottom;

  bottom = elen - 1;
  Q = e[bottom];
  for (eindex = elen - 2; eindex >= 0; eindex--) {
    enow = e[eindex];
    Fast_Two_Sum(Q, enow, Qnew, q);
    if (q != 0) {
      h[bottom--] = Qnew;
      Q = q;
    } else {
      Q = Qnew;
    }
  }
  top = 0;
  for (hindex = bottom + 1; hindex < elen; hindex++) {
    hnow = h[hindex];
    Fast_Two_Sum(hnow, Q, Qnew, q);
    if (q != 0) {
      h[top++] = q;
    }
    Q = Qnew;
  }
  h[top] = Q;
  return top + 1;
}